

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

bool __thiscall
deqp::egl::Image::GLES2ImageApi::ModifyTexSubImage::invokeGLES2
          (ModifyTexSubImage *this,GLES2ImageApi *api,
          MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *img,
          Texture2D *reference)

{
  GLenum GVar1;
  Functions *gl_00;
  glBindTextureFunc p_Var2;
  Library *egl;
  glTexSubImage2DFunc p_Var3;
  int iVar4;
  int iVar5;
  deUint32 dVar6;
  GLenum GVar7;
  deBool dVar8;
  int iVar9;
  MessageBuilder *this_00;
  PixelBufferAccess *pPVar10;
  UniqueImage *this_01;
  EGLImage img_00;
  void *pvVar11;
  EVP_PKEY_CTX *src_00;
  PixelBufferAccess local_290;
  Vector<float,_4> local_268;
  Vector<float,_4> local_258;
  MessageBuilder local_248;
  TextureFormat local_c8;
  undefined1 local_c0 [8];
  Texture2D src;
  int ySize;
  int xSize;
  int yOffset;
  int xOffset;
  Texture srcTex;
  TestLog *log;
  Functions *gl;
  Texture2D *reference_local;
  MovePtr<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_> *img_local;
  GLES2ImageApi *api_local;
  ModifyTexSubImage *this_local;
  
  gl_00 = api->m_gl;
  srcTex.super_ObjectWrapper._16_8_ = glu::CallLogWrapper::getLog(&api->super_CallLogWrapper);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&yOffset,gl_00);
  iVar4 = tcu::Texture2D::getWidth(reference);
  iVar4 = de::clamp<int>(0x10,0,iVar4 + -8);
  iVar5 = tcu::Texture2D::getHeight(reference);
  src.m_view.m_levels._0_4_ = de::clamp<int>(0x10,0,iVar5 + -0x10);
  local_c8 = glu::mapGLTransferFormat(this->m_format,this->m_type);
  tcu::Texture2D::Texture2D((Texture2D *)local_c0,&local_c8,iVar4,(int)src.m_view.m_levels);
  tcu::TestLog::operator<<
            (&local_248,(TestLog *)srcTex.super_ObjectWrapper._16_8_,
             (BeginMessageToken *)&tcu::TestLog::Message);
  this_00 = tcu::MessageBuilder::operator<<
                      (&local_248,(char (*) [41])"Modifying EGLImage with gl.texSubImage2D");
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_248);
  tcu::Texture2D::allocLevel((Texture2D *)local_c0,0);
  pPVar10 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_c0,0);
  tcu::Vector<float,_4>::Vector(&local_258,0.0,0.0,0.0,0.0);
  tcu::Vector<float,_4>::Vector(&local_268,1.0,1.0,1.0,1.0);
  tcu::fillWithComponentGradients(pPVar10,&local_258,&local_268);
  do {
    p_Var2 = gl_00->bindTexture;
    dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)&yOffset);
    (*p_Var2)(0xde1,dVar6);
    GVar7 = (*gl_00->getError)();
    glu::checkError(GVar7,"bindTexture(GL_TEXTURE_2D, *srcTex)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x310);
    dVar8 = ::deGetFalse();
  } while (dVar8 != 0);
  egl = (api->super_ImageApi).m_egl;
  this_01 = de::details::UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>::
            operator*(&img->
                       super_UniqueBase<eglu::UniqueImage,_de::DefaultDeleter<eglu::UniqueImage>_>);
  img_00 = eglu::UniqueImage::operator*(this_01);
  imageTargetTexture2D(egl,gl_00,img_00);
  do {
    p_Var3 = gl_00->texSubImage2D;
    iVar5 = tcu::Texture2D::getWidth((Texture2D *)local_c0);
    iVar9 = tcu::Texture2D::getHeight((Texture2D *)local_c0);
    GVar7 = this->m_format;
    GVar1 = this->m_type;
    pPVar10 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_c0,0);
    pvVar11 = tcu::PixelBufferAccess::getDataPtr(pPVar10);
    (*p_Var3)(0xde1,0,8,0x10,iVar5,iVar9,GVar7,GVar1,pvVar11);
    GVar7 = (*gl_00->getError)();
    glu::checkError(GVar7,
                    "texSubImage2D(GL_TEXTURE_2D, 0, xOffset, yOffset, src.getWidth(), src.getHeight(), m_format, m_type, src.getLevel(0).getDataPtr())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x312);
    dVar8 = ::deGetFalse();
  } while (dVar8 != 0);
  do {
    (*gl_00->bindTexture)(0xde1,0);
    GVar7 = (*gl_00->getError)();
    glu::checkError(GVar7,"bindTexture(GL_TEXTURE_2D, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x313);
    dVar8 = ::deGetFalse();
  } while (dVar8 != 0);
  do {
    (*gl_00->finish)();
    GVar7 = (*gl_00->getError)();
    glu::checkError(GVar7,"finish()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x314);
    dVar8 = ::deGetFalse();
  } while (dVar8 != 0);
  pPVar10 = tcu::TextureLevelPyramid::getLevel(&reference->super_TextureLevelPyramid,0);
  tcu::getSubregion(&local_290,pPVar10,8,0x10,0,iVar4,(int)src.m_view.m_levels,1);
  src_00 = (EVP_PKEY_CTX *)tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_c0,0);
  tcu::copy((EVP_PKEY_CTX *)&local_290,src_00);
  tcu::Texture2D::~Texture2D((Texture2D *)local_c0);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&yOffset);
  return true;
}

Assistant:

bool GLES2ImageApi::ModifyTexSubImage::invokeGLES2 (GLES2ImageApi& api, MovePtr<UniqueImage>& img, tcu::Texture2D& reference) const
{
	const glw::Functions&	gl		= api.m_gl;
	tcu::TestLog&			log		= api.getLog();
	glu::Texture			srcTex	(gl);
	const int				xOffset	= 8;
	const int				yOffset	= 16;
	const int				xSize	= de::clamp(16, 0, reference.getWidth() - xOffset);
	const int				ySize	= de::clamp(16, 0, reference.getHeight() - yOffset);
	tcu::Texture2D			src		(glu::mapGLTransferFormat(m_format, m_type), xSize, ySize);

	log << tcu::TestLog::Message << "Modifying EGLImage with gl.texSubImage2D" << tcu::TestLog::EndMessage;

	src.allocLevel(0);
	tcu::fillWithComponentGradients(src.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));

	GLU_CHECK_GLW_CALL(gl, bindTexture(GL_TEXTURE_2D, *srcTex));
	imageTargetTexture2D(api.m_egl, gl, **img);
	GLU_CHECK_GLW_CALL(gl, texSubImage2D(GL_TEXTURE_2D, 0, xOffset, yOffset, src.getWidth(), src.getHeight(), m_format, m_type, src.getLevel(0).getDataPtr()));
	GLU_CHECK_GLW_CALL(gl, bindTexture(GL_TEXTURE_2D, 0));
	GLU_CHECK_GLW_CALL(gl, finish());

	tcu::copy(tcu::getSubregion(reference.getLevel(0), xOffset, yOffset, 0, xSize, ySize, 1), src.getLevel(0));

	return true;
}